

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testScanner(DOMTest *this,XercesDOMParser *parser)

{
  undefined1 local_270 [8];
  SlicerSource src_3;
  SlicerSource src_2;
  XMLSize_t count_2;
  XMLSize_t slices_2 [2];
  undefined1 local_1b0 [8];
  SlicerSource src_1;
  XMLSize_t count_1;
  XMLSize_t slices_1 [2];
  undefined1 local_138 [8];
  SlicerSource src;
  XMLByte *sampleDocXML;
  size_t sampleDocSize;
  char sampleDoc [185];
  bool OK;
  XercesDOMParser *parser_local;
  DOMTest *this_local;
  
  sampleDoc[0xb7] = '\x01';
  unique0x100001fd = parser;
  memcpy(&sampleDocSize,
         "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<!-- Document element is document -->\n<document attr=\"value\">\n   <!-- a tag -->\n   <tag>foo</tag>\n\n   <!-- another tag -->\n   <tag/>\n</document>\n"
         ,0xb9);
  src.mCount = (XMLSize_t)&sampleDocSize;
  SlicerSource::SlicerSource
            ((SlicerSource *)local_138,(XMLByte *)&sampleDocSize,0xb8,(XMLSize_t *)0x0,0);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)stack0xffffffffffffffe8);
  SlicerSource::~SlicerSource((SlicerSource *)local_138);
  count_1 = 0x8e;
  slices_1[0] = 1;
  src_1.mCount = 2;
  SlicerSource::SlicerSource((SlicerSource *)local_1b0,(XMLByte *)src.mCount,0xb8,&count_1,2);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)stack0xffffffffffffffe8);
  SlicerSource::~SlicerSource((SlicerSource *)local_1b0);
  count_2 = 0x8e;
  slices_2[0] = 2;
  SlicerSource::SlicerSource((SlicerSource *)&src_3.mCount,(XMLByte *)src.mCount,0xb8,&count_2,2);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)stack0xffffffffffffffe8);
  SlicerSource::~SlicerSource((SlicerSource *)&src_3.mCount);
  SlicerSource::SlicerSource
            ((SlicerSource *)local_270,(XMLByte *)src.mCount,0xb8,testScanner::slices,0xb8);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)stack0xffffffffffffffe8);
  SlicerSource::~SlicerSource((SlicerSource *)local_270);
  return (bool)(sampleDoc[0xb7] & 1);
}

Assistant:

bool DOMTest::testScanner(XercesDOMParser* parser) {
    bool OK = true;

    const char sampleDoc[] =
	    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
	    "<!-- Document element is document -->\n"
	    "<document attr=\"value\">\n"
	    "   <!-- a tag -->\n"
	    "   <tag>foo</tag>\n"
	    "\n"
	    "   <!-- another tag -->\n"
	    "   <tag/>\n"
	    "</document>\n";
    const size_t sampleDocSize = sizeof(sampleDoc) - 1;
    const XMLByte* sampleDocXML = reinterpret_cast<const XMLByte*>(sampleDoc);

    try
	{
		// First, try parsing the document in one hit
		SlicerSource src(sampleDocXML, sampleDocSize);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!' and '--' of a comment
		const XMLSize_t slices[] = { 142, 1 };
		const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!-' and '-' of a comment
		const XMLSize_t slices[] = { 142, 2 };
		const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!-' and '-' of a comment
		static const XMLSize_t slices[] =
        {
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1};
		static const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

    return OK;
}